

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::collectremovepoints(tetgenmesh *this,arraypool *remptlist)

{
  long lVar1;
  uint *puVar2;
  byte bVar3;
  memorypool *pmVar4;
  void **ppvVar5;
  double *pdVar6;
  ulong uVar7;
  tetgenbehavior *ptVar8;
  undefined8 uVar9;
  char **ppcVar10;
  double dVar11;
  int iVar12;
  point searchpt;
  char *pcVar13;
  void *pvVar14;
  arraypool *paVar15;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  double dVar22;
  
  if (this->b->metric != 0) {
    pmVar4 = this->points;
    ppvVar5 = pmVar4->firstblock;
    pmVar4->pathblock = ppvVar5;
    pmVar4->pathitem =
         (void *)((long)ppvVar5 +
                 (((long)pmVar4->alignbytes + 8U) -
                 (ulong)(ppvVar5 + 1) % (ulong)(long)pmVar4->alignbytes));
    pmVar4->pathitemsleft = pmVar4->itemsperblock;
    do {
      searchpt = (point)memorypool::traverse(this->points);
      if (searchpt == (point)0x0) {
        searchpt = (point)0x0;
        break;
      }
    } while ((*(uint *)((long)searchpt + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00)
    ;
joined_r0x0014356b:
    if (searchpt != (point)0x0) {
      if (0.0 < searchpt[this->pointmtrindex]) {
        getvertexstar(this,1,searchpt,this->cavetetlist,this->cavetetvertlist,(arraypool *)0x0);
        pdVar6 = *(double **)*this->cavetetvertlist->toparray;
        dVar22 = (pdVar6[2] - searchpt[2]) * (pdVar6[2] - searchpt[2]) +
                 (*pdVar6 - *searchpt) * (*pdVar6 - *searchpt) +
                 (pdVar6[1] - searchpt[1]) * (pdVar6[1] - searchpt[1]);
        if (dVar22 < 0.0) {
          dVar22 = sqrt(dVar22);
        }
        else {
          dVar22 = SQRT(dVar22);
        }
        paVar15 = this->cavetetvertlist;
        if (1 < paVar15->objects) {
          lVar21 = 1;
          do {
            pdVar6 = *(double **)
                      (paVar15->toparray
                       [(uint)lVar21 >> ((byte)paVar15->log2objectsperblock & 0x1f)] +
                      (long)paVar15->objectbytes *
                      (long)(int)(paVar15->objectsperblockmark & (uint)lVar21));
            dVar11 = (pdVar6[2] - searchpt[2]) * (pdVar6[2] - searchpt[2]) +
                     (*pdVar6 - *searchpt) * (*pdVar6 - *searchpt) +
                     (pdVar6[1] - searchpt[1]) * (pdVar6[1] - searchpt[1]);
            if (dVar11 < 0.0) {
              dVar11 = sqrt(dVar11);
            }
            else {
              dVar11 = SQRT(dVar11);
            }
            if (dVar22 <= dVar11) {
              dVar11 = dVar22;
            }
            dVar22 = dVar11;
            lVar21 = lVar21 + 1;
            paVar15 = this->cavetetvertlist;
          } while (lVar21 < paVar15->objects);
        }
        paVar15->objects = 0;
        this->cavetetlist->objects = 0;
        if (dVar22 < searchpt[this->pointmtrindex]) {
          puVar2 = (uint *)((long)searchpt + (long)this->pointmarkindex * 4 + 4);
          *puVar2 = *puVar2 | 1;
          pcVar13 = arraypool::getblock(remptlist,(int)remptlist->objects);
          uVar7 = remptlist->objects;
          remptlist->objects = uVar7 + 1;
          *(point *)(pcVar13 +
                    (long)remptlist->objectbytes * ((long)remptlist->objectsperblock - 1U & uVar7))
               = searchpt;
        }
      }
      do {
        searchpt = (point)memorypool::traverse(this->points);
        if (searchpt == (point)0x0) {
          searchpt = (point)0x0;
          break;
        }
      } while ((*(uint *)((long)searchpt + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) ==
               0xa00);
      goto joined_r0x0014356b;
    }
    if (1 < this->b->verbose) {
      printf("    Coarsen %ld oversized points.\n");
    }
  }
  if (this->in->pointmarkerlist != (int *)0x0) {
    pmVar4 = this->points;
    ppvVar5 = pmVar4->firstblock;
    pmVar4->pathblock = ppvVar5;
    pmVar4->pathitem =
         (void *)((long)ppvVar5 +
                 (((long)pmVar4->alignbytes + 8U) -
                 (ulong)(ppvVar5 + 1) % (ulong)(long)pmVar4->alignbytes));
    pmVar4->pathitemsleft = pmVar4->itemsperblock;
    do {
      pvVar14 = memorypool::traverse(this->points);
      if (pvVar14 == (void *)0x0) {
        pvVar14 = (void *)0x0;
        break;
      }
    } while ((*(uint *)((long)pvVar14 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00);
    if (pvVar14 != (void *)0x0) {
      lVar21 = 0;
      do {
        if (this->in->numberofpoints <= lVar21) break;
        if (this->in->pointmarkerlist[lVar21] == -1) {
          puVar2 = (uint *)((long)pvVar14 + (long)this->pointmarkindex * 4 + 4);
          *puVar2 = *puVar2 | 1;
          pcVar13 = arraypool::getblock(remptlist,(int)remptlist->objects);
          uVar7 = remptlist->objects;
          remptlist->objects = uVar7 + 1;
          *(void **)(pcVar13 +
                    (long)remptlist->objectbytes * ((long)remptlist->objectsperblock - 1U & uVar7))
               = pvVar14;
        }
        lVar21 = lVar21 + 1;
        do {
          pvVar14 = memorypool::traverse(this->points);
          if (pvVar14 == (void *)0x0) {
            pvVar14 = (void *)0x0;
            break;
          }
        } while ((*(uint *)((long)pvVar14 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) ==
                 0xa00);
      } while (pvVar14 != (void *)0x0);
    }
    if (1 < this->b->verbose) {
      printf("    Coarsen %ld marked points.\n");
    }
  }
  ptVar8 = this->b;
  if (0 < ptVar8->coarsen_param) {
    if (1 < ptVar8->verbose) {
      printf("    Coarsen %g percent of interior points.\n",SUB84(ptVar8->coarsen_percent * 100.0,0)
            );
    }
    paVar15 = (arraypool *)operator_new(0x30);
    paVar15->objectbytes = 8;
    paVar15->objectsperblock = 0x400;
    paVar15->log2objectsperblock = 10;
    paVar15->objectsperblockmark = 0x3ff;
    paVar15->toparraylen = 0;
    paVar15->toparray = (char **)0x0;
    paVar15->objects = 0;
    paVar15->totalmemory = 0;
    pmVar4 = this->points;
    ppvVar5 = pmVar4->firstblock;
    pmVar4->pathblock = ppvVar5;
    pmVar4->pathitem =
         (void *)((long)ppvVar5 +
                 (((long)pmVar4->alignbytes + 8U) -
                 (ulong)(ppvVar5 + 1) % (ulong)(long)pmVar4->alignbytes));
    pmVar4->pathitemsleft = pmVar4->itemsperblock;
    do {
      pvVar14 = memorypool::traverse(this->points);
      if (pvVar14 == (void *)0x0) {
        pvVar14 = (void *)0x0;
        break;
      }
    } while ((*(uint *)((long)pvVar14 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00);
joined_r0x0014396e:
    if (pvVar14 != (void *)0x0) {
      if ((*(int *)((long)pvVar14 + (long)this->pointmarkindex * 4 + 4) >> 8) - 5U < 4) {
        pcVar13 = arraypool::getblock(paVar15,(int)paVar15->objects);
        uVar7 = paVar15->objects;
        paVar15->objects = uVar7 + 1;
        *(void **)(pcVar13 +
                  (long)paVar15->objectbytes * ((long)paVar15->objectsperblock - 1U & uVar7)) =
             pvVar14;
      }
      do {
        pvVar14 = memorypool::traverse(this->points);
        if (pvVar14 == (void *)0x0) {
          pvVar14 = (void *)0x0;
          break;
        }
      } while ((*(uint *)((long)pvVar14 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00
              );
      goto joined_r0x0014396e;
    }
    if (0 < paVar15->objects) {
      srand((uint)paVar15->objects);
      lVar21 = paVar15->objects;
      if (0 < lVar21) {
        lVar18 = 0;
        do {
          iVar12 = rand();
          lVar1 = lVar18 + 1;
          uVar17 = iVar12 % (int)lVar1;
          bVar3 = (byte)paVar15->log2objectsperblock;
          pcVar13 = paVar15->toparray[(uint)lVar18 >> (bVar3 & 0x1f)];
          iVar19 = ((uint)lVar18 & paVar15->objectsperblockmark) * paVar15->objectbytes;
          pcVar16 = paVar15->toparray[(int)uVar17 >> (bVar3 & 0x1f)];
          iVar12 = (paVar15->objectsperblockmark & uVar17) * paVar15->objectbytes;
          uVar9 = *(undefined8 *)(pcVar13 + iVar19);
          *(undefined8 *)(pcVar13 + iVar19) = *(undefined8 *)(pcVar16 + iVar12);
          *(undefined8 *)(pcVar16 + iVar12) = uVar9;
          lVar21 = paVar15->objects;
          lVar18 = lVar1;
        } while (lVar1 < lVar21);
      }
      uVar17 = (uint)((double)lVar21 * this->b->coarsen_percent);
      if (0 < (int)uVar17) {
        uVar20 = 0;
        do {
          pcVar13 = paVar15->toparray[uVar20 >> ((byte)paVar15->log2objectsperblock & 0x1f)];
          lVar21 = (long)paVar15->objectbytes * (long)(int)(paVar15->objectsperblockmark & uVar20);
          if ((*(byte *)(*(long *)(pcVar13 + lVar21) + 4 + (long)this->pointmarkindex * 4) & 1) == 0
             ) {
            pcVar16 = arraypool::getblock(remptlist,(int)remptlist->objects);
            uVar7 = remptlist->objects;
            remptlist->objects = uVar7 + 1;
            *(undefined8 *)
             (pcVar16 +
             (long)remptlist->objectbytes * ((long)remptlist->objectsperblock - 1U & uVar7)) =
                 *(undefined8 *)(pcVar13 + lVar21);
          }
          uVar20 = uVar20 + 1;
        } while (uVar17 != uVar20);
      }
    }
    arraypool::~arraypool(paVar15);
    operator_delete(paVar15,0x30);
  }
  lVar21 = remptlist->objects;
  if (0 < lVar21) {
    ppcVar10 = remptlist->toparray;
    lVar18 = 0;
    do {
      puVar2 = (uint *)(*(long *)(ppcVar10[(uint)lVar18 >>
                                           ((byte)remptlist->log2objectsperblock & 0x1f)] +
                                 (long)remptlist->objectbytes *
                                 (long)(int)(remptlist->objectsperblockmark & (uint)lVar18)) + 4 +
                       (long)this->pointmarkindex * 4);
      *puVar2 = *puVar2 & 0xfffffffe;
      lVar18 = lVar18 + 1;
    } while (lVar21 != lVar18);
  }
  return;
}

Assistant:

void tetgenmesh::collectremovepoints(arraypool *remptlist)
{
  point ptloop, *parypt;
  verttype vt;

  // If a mesh sizing function is given. Collect vertices whose mesh size
  //   is greater than its smallest edge length.
  if (b->metric) { // -m option
    REAL len, smlen;
    int i;
    points->traversalinit();
    ptloop = pointtraverse();
    while (ptloop != NULL) {
      if (ptloop[pointmtrindex] > 0) {
        // Get the smallest edge length at this vertex.
        getvertexstar(1, ptloop, cavetetlist, cavetetvertlist, NULL);
        parypt = (point *) fastlookup(cavetetvertlist, 0);
        smlen = distance(ptloop, *parypt);
        for (i = 1; i < cavetetvertlist->objects; i++) {
          parypt = (point *) fastlookup(cavetetvertlist, i);
          len = distance(ptloop, *parypt);
          if (len < smlen) {
            smlen = len;
          }
        }
        cavetetvertlist->restart();
        cavetetlist->restart();
        if (smlen < ptloop[pointmtrindex]) {
          pinfect(ptloop);
          remptlist->newindex((void **) &parypt);
          *parypt = ptloop;
        }
      }
      ptloop = pointtraverse();
    }
    if (b->verbose > 1) {
      printf("    Coarsen %ld oversized points.\n", remptlist->objects); 
    }
  }

  // If 'in->pointmarkerlist' exists, Collect vertices with markers '-1'.
  if (in->pointmarkerlist != NULL) {
    long bak_count = remptlist->objects;
    points->traversalinit();
    ptloop = pointtraverse();
    int index = 0;
    while (ptloop != NULL) {
      if (index < in->numberofpoints) {
        if (in->pointmarkerlist[index] == -1) {
          pinfect(ptloop);
          remptlist->newindex((void **) &parypt);
          *parypt = ptloop;
        }
      } else {
        // Remaining are not input points. Stop here.
        break; 
      }
      index++;
      ptloop = pointtraverse();
    }
    if (b->verbose > 1) {
      printf("    Coarsen %ld marked points.\n", remptlist->objects - bak_count); 
    }
  } // if (in->pointmarkerlist != NULL)

  if (b->coarsen_param > 0) { // -R1/#
    // Remove a coarsen_percent number of interior points.
    if (b->verbose > 1) {
      printf("    Coarsen %g percent of interior points.\n", 
             b->coarsen_percent * 100.0);
    }
    arraypool *intptlist = new arraypool(sizeof(point *), 10);
    // Count the total number of interior points.
    points->traversalinit();
    ptloop = pointtraverse();
    while (ptloop != NULL) {
      vt = pointtype(ptloop);
      if ((vt == VOLVERTEX) || (vt == FREEVOLVERTEX) || 
          (vt == FREEFACETVERTEX) || (vt == FREESEGVERTEX)) {
        intptlist->newindex((void **) &parypt);
        *parypt = ptloop;
      }
      ptloop = pointtraverse();
    }
    if (intptlist->objects > 0l) {
      // Sort the list of points randomly.
      point *parypt_i, swappt;
      int randindex, i;
      srand(intptlist->objects);
      for (i = 0; i < intptlist->objects; i++) {
        randindex = rand() % (i + 1); // randomnation(i + 1);
        parypt_i = (point *) fastlookup(intptlist, i); 
        parypt = (point *) fastlookup(intptlist, randindex);
        // Swap this two points.
        swappt = *parypt_i;
        *parypt_i = *parypt;
        *parypt = swappt;
      }
      int remcount = (int) ((REAL) intptlist->objects * b->coarsen_percent);
      // Return the first remcount points.
      for (i = 0; i < remcount; i++) {
        parypt_i = (point *) fastlookup(intptlist, i);
        if (!pinfected(*parypt_i)) {
          pinfected(*parypt_i);
          remptlist->newindex((void **) &parypt);
          *parypt = *parypt_i;
        }
      }
    }
    delete intptlist;
  }

  // Unmark all collected vertices.
  for (int i = 0; i < remptlist->objects; i++) {
    parypt = (point *) fastlookup(remptlist, i);
    puninfect(*parypt);
  }
}